

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

double GetHeaderInformation(char *filename,char *parameter)

{
  int iVar1;
  int local_44;
  double dStack_40;
  int answer_1;
  double answer;
  char local_2d;
  int i;
  FILE *pFStack_28;
  char data_check [5];
  FILE *fp;
  char *parameter_local;
  char *filename_local;
  
  pFStack_28 = fopen(filename,"rb");
  if (pFStack_28 == (FILE *)0x0) {
    printf("File cannot be opened.\n");
  }
  else {
    i._3_1_ = 0;
    for (answer._4_4_ = 0; answer._4_4_ < 0xd; answer._4_4_ = answer._4_4_ + 1) {
      fread(&local_2d,1,4,pFStack_28);
      iVar1 = strcmp(&local_2d,parameter);
      if (iVar1 == 0) {
        iVar1 = strcmp(parameter,"FP  ");
        if (iVar1 != 0) {
          fread(&local_44,4,1,pFStack_28);
          fclose(pFStack_28);
          return (double)local_44;
        }
        fread(&stack0xffffffffffffffc0,8,1,pFStack_28);
        fclose(pFStack_28);
        return dStack_40;
      }
    }
  }
  return 0.0;
}

Assistant:

double GetHeaderInformation(const char *filename, const char *parameter) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  char data_check[5];
  data_check[4] = '\0';
  for (int i = 0; i < 13; ++i) {
    fread(data_check, 1, 4, fp);
    if (0 != strcmp(data_check, parameter)) continue;
    if (0 == strcmp(parameter, "FP  ")) {
      double answer;
      fread(&answer, 8, 1, fp);
      fclose(fp);
      return answer;
    } else {
      int answer;
      fread(&answer, 4, 1, fp);
      fclose(fp);
      return static_cast<double>(answer);
    }
  }
  return 0;
}